

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::IteratorSymbol::IteratorSymbol
          (IteratorSymbol *this,Scope *scope,string_view name,SourceLocation loc,Type *arrayType,
          string_view indexMethodName)

{
  string_view name_00;
  Type *pTVar1;
  Compilation *this_00;
  size_t in_RCX;
  SourceLocation in_RDX;
  Scope *in_RSI;
  ValueSymbol *in_RDI;
  TempVarSymbol *in_R8;
  char *in_R9;
  Type *elemType;
  Type *type;
  Type *in_stack_ffffffffffffffa8;
  VariableLifetime in_stack_ffffffffffffffb0;
  SymbolKind in_stack_ffffffffffffffb4;
  
  type = (Type *)&stack0x00000008;
  name_00._M_str = in_R9;
  name_00._M_len = in_RCX;
  TempVarSymbol::TempVarSymbol
            (in_R8,in_stack_ffffffffffffffb4,name_00,in_RDX,in_stack_ffffffffffffffb0);
  in_RDI[1].super_Symbol.name._M_str = in_R9;
  in_RDI[1].super_Symbol.location = *(SourceLocation *)&type->super_Symbol;
  in_RDI[1].super_Symbol.parentScope = (Scope *)(type->super_Symbol).name._M_len;
  bitmask<slang::ast::VariableFlags>::bitmask
            ((bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffb6,Const);
  bitmask<slang::ast::VariableFlags>::operator|=
            ((bitmask<slang::ast::VariableFlags> *)&in_RDI[1].super_Symbol.field_0x4,
             (bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffb6);
  Symbol::setParent(&in_RDI->super_Symbol,in_RSI);
  pTVar1 = Type::getArrayElementType(in_stack_ffffffffffffffa8);
  if (pTVar1 == (Type *)0x0) {
    this_00 = Scope::getCompilation(in_RSI);
    Compilation::getErrorType(this_00);
  }
  ValueSymbol::setType(in_RDI,type);
  return;
}

Assistant:

IteratorSymbol::IteratorSymbol(const Scope& scope, std::string_view name, SourceLocation loc,
                               const Type& arrayType, std::string_view indexMethodName) :
    TempVarSymbol(SymbolKind::Iterator, name, loc, VariableLifetime::Automatic),
    arrayType(arrayType), indexMethodName(indexMethodName) {

    flags |= VariableFlags::Const;
    setParent(scope);

    const Type* elemType = arrayType.getArrayElementType();
    if (!elemType)
        elemType = &scope.getCompilation().getErrorType();

    setType(*elemType);
}